

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connecter.cpp
# Opt level: O3

void __thiscall zmq::tcp_connecter_t::out_event(tcp_connecter_t *this)

{
  bool bVar1;
  int fd_;
  int *piVar2;
  socklen_t in_ECX;
  sockaddr *__addr;
  int in_ESI;
  session_base_t *destination_;
  string local_38;
  
  if (this->_connect_timer_started == true) {
    in_ESI = 2;
    io_object_t::cancel_timer(&(this->super_stream_connecter_base_t).super_io_object_t,2);
    this->_connect_timer_started = false;
  }
  stream_connecter_base_t::rm_handle(&this->super_stream_connecter_base_t);
  fd_ = connect(this,in_ESI,__addr,in_ECX);
  if (fd_ == -1) {
    if (((this->super_stream_connecter_base_t).super_own_t.options.reconnect_stop & 1) != 0) {
      piVar2 = __errno_location();
      if (*piVar2 == 0x6f) {
        destination_ = (this->super_stream_connecter_base_t)._session;
        object_t::send_conn_failed((object_t *)this,destination_);
        stream_connecter_base_t::close(&this->super_stream_connecter_base_t,(int)destination_);
        own_t::terminate((own_t *)this);
        return;
      }
    }
  }
  else {
    in_ESI = fd_;
    bVar1 = tune_socket(this,fd_);
    if (bVar1) {
      get_socket_name<zmq::tcp_address_t>(&local_38,fd_,socket_end_local);
      stream_connecter_base_t::create_engine(&this->super_stream_connecter_base_t,fd_,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  stream_connecter_base_t::close(&this->super_stream_connecter_base_t,in_ESI);
  stream_connecter_base_t::add_reconnect_timer(&this->super_stream_connecter_base_t);
  return;
}

Assistant:

void zmq::tcp_connecter_t::out_event ()
{
    if (_connect_timer_started) {
        cancel_timer (connect_timer_id);
        _connect_timer_started = false;
    }

    //  TODO this is still very similar to (t)ipc_connecter_t, maybe the
    //  differences can be factored out

    rm_handle ();

    const fd_t fd = connect ();

    if (fd == retired_fd
        && ((options.reconnect_stop & ZMQ_RECONNECT_STOP_CONN_REFUSED)
            && errno == ECONNREFUSED)) {
        send_conn_failed (_session);
        close ();
        terminate ();
        return;
    }

    //  Handle the error condition by attempt to reconnect.
    if (fd == retired_fd || !tune_socket (fd)) {
        close ();
        add_reconnect_timer ();
        return;
    }

    create_engine (fd, get_socket_name<tcp_address_t> (fd, socket_end_local));
}